

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stepper.cpp
# Opt level: O1

void __thiscall QtMWidgets::Stepper::_q_autorepeat(Stepper *this)

{
  StepperPrivate *pSVar1;
  uint uVar2;
  
  pSVar1 = (this->d).d;
  uVar2 = pSVar1->autorepeatCount + 1;
  pSVar1->autorepeatCount = uVar2;
  if (uVar2 == 5) {
    pSVar1->timeout = 0xfa;
    QTimer::stop();
    QTimer::start((int)((this->d).d)->timer);
  }
  StepperPrivate::makeClick((this->d).d);
  return;
}

Assistant:

void
Stepper::_q_autorepeat()
{
	++d->autorepeatCount;

	if( d->autorepeatCount == autorepeatChangeTimeoutCount )
	{
		d->timeout = fastTimeout;

		d->timer->stop();

		d->timer->start( d->timeout );
	}

	d->makeClick();
}